

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
BamTools::BamAlignment::GetTagNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,BamAlignment *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  undefined8 uVar5;
  uint uVar6;
  uint numBytesParsed;
  char *pTagData;
  uint local_5c;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((this->SupportData).HasCoreOnly == false) &&
     (sVar2 = (this->TagData)._M_string_length, sVar2 != 0)) {
    local_58 = (this->TagData)._M_dataplus._M_p;
    local_5c = 0;
    uVar6 = (uint)sVar2;
    if (uVar6 != 0) {
      paVar1 = &local_50.field_2;
      do {
        pcVar3 = local_58;
        local_5c = local_5c + 3;
        local_50._M_dataplus._M_p = (pointer)paVar1;
        if (local_58 == (char *)0x0) {
          local_58 = local_58 + 3;
          uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(__return_storage_ptr__);
          _Unwind_Resume(uVar5);
        }
        local_50.field_2._M_allocated_capacity._0_2_ = *(undefined2 *)local_58;
        local_50._M_string_length = 2;
        local_50.field_2._M_local_buf[2] = '\0';
        local_58 = local_58 + 3;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (pcVar3[2] == '\0') {
LAB_001440fe:
          bVar4 = false;
        }
        else {
          bVar4 = SkipToNextTag(this,pcVar3[2],&local_58,&local_5c);
          if (!bVar4) goto LAB_001440fe;
          bVar4 = *local_58 != '\0';
        }
      } while ((bVar4) && (local_5c < uVar6));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> BamAlignment::GetTagNames() const
{

    std::vector<std::string> result;
    if (SupportData.HasCoreOnly || TagData.empty()) {
        return result;
    }

    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;
    while (numBytesParsed < tagDataLength) {

        // get current tag name & type
        const char* pTagName = pTagData;
        const char* pTagType = pTagData + 2;
        pTagData += 3;
        numBytesParsed += 3;

        // store tag name
        result.push_back(std::string(pTagName, 2));

        // find the next tag
        if (*pTagType == '\0') {
            break;
        }
        if (!SkipToNextTag(*pTagType, pTagData, numBytesParsed)) {
            break;
        }
        if (*pTagData == '\0') {
            break;
        }
    }

    return result;
}